

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrTrackingOptimizationSettingsHintQCOM value)

{
  bool bVar1;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b8;
  allocator local_99;
  string local_98 [8];
  string error_str;
  allocator local_61;
  string local_60 [8];
  string vuid;
  XrTrackingOptimizationSettingsHintQCOM value_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *item_name_local;
  string *validation_name_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
     (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                               "XR_QCOM_tracking_optimization_settings"), bVar1)) {
    switch(value) {
    case XR_TRACKING_OPTIMIZATION_SETTINGS_HINT_NONE_QCOM:
      instance_info_local._7_1_ = true;
      break;
    case XR_TRACKING_OPTIMIZATION_SETTINGS_HINT_LONG_RANGE_PRIORIZATION_QCOM:
      instance_info_local._7_1_ = true;
      break;
    case XR_TRACKING_OPTIMIZATION_SETTINGS_HINT_CLOSE_RANGE_PRIORIZATION_QCOM:
      instance_info_local._7_1_ = true;
      break;
    case XR_TRACKING_OPTIMIZATION_SETTINGS_HINT_LOW_POWER_PRIORIZATION_QCOM:
      instance_info_local._7_1_ = true;
      break;
    case XR_TRACKING_OPTIMIZATION_SETTINGS_HINT_HIGH_POWER_PRIORIZATION_QCOM:
      instance_info_local._7_1_ = true;
      break;
    default:
      instance_info_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"VUID-",&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::operator+=(local_60,(string *)validation_name);
    std::__cxx11::string::operator+=(local_60,"-");
    std::__cxx11::string::operator+=(local_60,(string *)item_name);
    std::__cxx11::string::operator+=(local_60,"-parameter");
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,"XrTrackingOptimizationSettingsHintQCOM requires extension ",&local_99);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::operator+=
              (local_98,
               " \"XR_QCOM_tracking_optimization_settings\" to be enabled, but it is not enabled");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_b8,objects_info);
    CoreValidLogMessage(instance_info,(string *)local_60,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                        command_name,&local_b8,(string *)local_98);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_b8);
    instance_info_local._7_1_ = false;
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_60);
  }
  return instance_info_local._7_1_;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrTrackingOptimizationSettingsHintQCOM value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_QCOM_tracking_optimization_settings, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_QCOM_tracking_optimization_settings")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrTrackingOptimizationSettingsHintQCOM requires extension ";
        error_str += " \"XR_QCOM_tracking_optimization_settings\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_TRACKING_OPTIMIZATION_SETTINGS_HINT_NONE_QCOM:
            return true;
        case XR_TRACKING_OPTIMIZATION_SETTINGS_HINT_LONG_RANGE_PRIORIZATION_QCOM:
            return true;
        case XR_TRACKING_OPTIMIZATION_SETTINGS_HINT_CLOSE_RANGE_PRIORIZATION_QCOM:
            return true;
        case XR_TRACKING_OPTIMIZATION_SETTINGS_HINT_LOW_POWER_PRIORIZATION_QCOM:
            return true;
        case XR_TRACKING_OPTIMIZATION_SETTINGS_HINT_HIGH_POWER_PRIORIZATION_QCOM:
            return true;
    default:
        return false;
}
}